

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O2

void __thiscall SaveButton::~SaveButton(SaveButton *this)

{
  Button::~Button((Button *)this);
  operator_delete(this,0x60);
  return;
}

Assistant:

SaveButton() : ToggleButton("Save raw") {}